

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterLoadNPos(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  u8 *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int nSz;
  uint local_1c;
  
  if (p->rc != 0) {
    return;
  }
  uVar6 = pIter->iLeafOffset;
  lVar4 = (long)(int)uVar6;
  if (p->pConfig->eDetail == 1) {
    iVar3 = pIter->pLeaf->szLeaf;
    if (pIter->iEndofDoclist < iVar3) {
      iVar3 = pIter->iEndofDoclist;
    }
    pIter->bDel = '\0';
    pIter->nPos = 1;
    if (((int)uVar6 < iVar3) && (puVar2 = pIter->pLeaf->p, puVar2[lVar4] == '\0')) {
      pIter->bDel = '\x01';
      uVar5 = lVar4 + 1;
      if ((iVar3 <= (int)uVar5) || (puVar2[uVar5] != '\0')) {
        pIter->nPos = 0;
        goto LAB_001cbeb0;
      }
      pIter->nPos = 1;
      uVar6 = uVar6 + 2;
    }
    uVar5 = (ulong)uVar6;
  }
  else {
    puVar2 = pIter->pLeaf->p;
    bVar1 = puVar2[lVar4];
    local_1c = (uint)bVar1;
    iVar3 = 1;
    if ((char)bVar1 < '\0') {
      local_1c = (uint)bVar1;
      iVar3 = sqlite3Fts5GetVarint32(puVar2 + lVar4,&local_1c);
    }
    pIter->bDel = (byte)local_1c & 1;
    pIter->nPos = (int)local_1c >> 1;
    uVar5 = (ulong)(iVar3 + uVar6);
  }
LAB_001cbeb0:
  pIter->iLeafOffset = (int)uVar5;
  return;
}

Assistant:

static void fts5SegIterLoadNPos(Fts5Index *p, Fts5SegIter *pIter){
  if( p->rc==SQLITE_OK ){
    int iOff = pIter->iLeafOffset;  /* Offset to read at */
    ASSERT_SZLEAF_OK(pIter->pLeaf);
    if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
      int iEod = MIN(pIter->iEndofDoclist, pIter->pLeaf->szLeaf);
      pIter->bDel = 0;
      pIter->nPos = 1;
      if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
        pIter->bDel = 1;
        iOff++;
        if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
          pIter->nPos = 1;
          iOff++;
        }else{
          pIter->nPos = 0;
        }
      }
    }else{
      int nSz;
      fts5FastGetVarint32(pIter->pLeaf->p, iOff, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
    pIter->iLeafOffset = iOff;
  }
}